

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O3

void simpleMinimal(word *x,word *pAux,word *minimal,permInfo *pi,int nVars)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  word *pIn;
  
  Kit_TruthCopy_64bit(pAux,x,nVars);
  Kit_TruthNot_64bit(x,nVars);
  iVar2 = memCompare(x,pAux,nVars);
  pIn = pAux;
  if (iVar2 == -1) {
    pIn = x;
  }
  Kit_TruthCopy_64bit(minimal,pIn,nVars);
  if (0 < (long)pi->totalSwaps) {
    uVar3 = (long)pi->totalSwaps + 1;
    do {
      Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[uVar3 - 2]);
      Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[uVar3 - 2]);
      iVar2 = memCompare(x,pAux,nVars);
      if (iVar2 < 1) {
        iVar2 = memCompare(x,minimal,nVars);
        if (iVar2 < 0) {
          Kit_TruthCopy_64bit(minimal,x,nVars);
          goto LAB_005e5847;
        }
      }
      else {
LAB_005e5847:
        iVar2 = memCompare(pAux,minimal,nVars);
        if (iVar2 < 1) {
          Kit_TruthCopy_64bit(minimal,pAux,nVars);
        }
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  lVar4 = (long)pi->totalFlips;
  if (0 < (long)pi->totalFlips) {
    do {
      Kit_TruthSwapAdjacentVars_64bit(x,nVars,0);
      Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,0);
      Kit_TruthChangePhase_64bit(x,nVars,pi->flipArray[lVar4 + -1]);
      Kit_TruthChangePhase_64bit(pAux,nVars,pi->flipArray[lVar4 + -1]);
      iVar2 = memCompare(x,pAux,nVars);
      if (iVar2 < 1) {
        iVar2 = memCompare(x,minimal,nVars);
        if (iVar2 < 0) {
          Kit_TruthCopy_64bit(minimal,x,nVars);
          goto LAB_005e58ec;
        }
      }
      else {
LAB_005e58ec:
        iVar2 = memCompare(pAux,minimal,nVars);
        if (iVar2 < 1) {
          Kit_TruthCopy_64bit(minimal,pAux,nVars);
        }
      }
      if (0 < (long)pi->totalSwaps) {
        uVar3 = (long)pi->totalSwaps + 1;
        do {
          Kit_TruthSwapAdjacentVars_64bit(x,nVars,pi->swapArray[uVar3 - 2]);
          Kit_TruthSwapAdjacentVars_64bit(pAux,nVars,pi->swapArray[uVar3 - 2]);
          iVar2 = memCompare(x,pAux,nVars);
          if (iVar2 < 1) {
            iVar2 = memCompare(x,minimal,nVars);
            if (iVar2 < 0) {
              Kit_TruthCopy_64bit(minimal,x,nVars);
              goto LAB_005e596a;
            }
          }
          else {
LAB_005e596a:
            iVar2 = memCompare(pAux,minimal,nVars);
            if (iVar2 < 1) {
              Kit_TruthCopy_64bit(minimal,pAux,nVars);
            }
          }
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
      }
      bVar1 = 1 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar1);
  }
  Kit_TruthCopy_64bit(x,minimal,nVars);
  return;
}

Assistant:

void simpleMinimal(word* x, word* pAux,word* minimal, permInfo* pi, int nVars)
{
    int i,j=0;
    Kit_TruthCopy_64bit( pAux, x, nVars );
    Kit_TruthNot_64bit( x, nVars );
    
    minWord(x, pAux, minimal, nVars);
    
    for(i=pi->totalSwaps-1;i>=0;i--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
        minWord3(x, pAux, minimal, nVars);
    }
    for(j=pi->totalFlips-1;j>=0;j--)
    {
        Kit_TruthSwapAdjacentVars_64bit(x, nVars, 0);
        Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, 0);
        Kit_TruthChangePhase_64bit(x, nVars, pi->flipArray[j]);
        Kit_TruthChangePhase_64bit(pAux, nVars, pi->flipArray[j]);
        minWord3(x, pAux, minimal, nVars);
        for(i=pi->totalSwaps-1;i>=0;i--)
        {
            Kit_TruthSwapAdjacentVars_64bit(x, nVars, pi->swapArray[i]);
            Kit_TruthSwapAdjacentVars_64bit(pAux, nVars, pi->swapArray[i]);
            minWord3(x, pAux, minimal, nVars);
        }
    } 
    Kit_TruthCopy_64bit( x, minimal, nVars );    
}